

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall
myEmployeeCustomConstructor::myEmployeeCustomConstructor
          (myEmployeeCustomConstructor *this,int m_kids,double m_latitude)

{
  allocator local_41;
  string local_40;
  double local_20;
  double m_latitude_local;
  myEmployeeCustomConstructor *pmStack_10;
  int m_kids_local;
  myEmployeeCustomConstructor *this_local;
  
  local_20 = m_latitude;
  m_latitude_local._4_4_ = m_kids;
  pmStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"John",&local_41);
  myEmployee::myEmployee(&this->super_myEmployee,0x50,4000.0,ATHLETIC,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_myEmployee)._vptr_myEmployee =
       (_func_int **)&PTR__myEmployeeCustomConstructor_001d6738;
  this->latitude = local_20;
  this->kids = m_latitude_local._4_4_;
  this->legs = 2;
  return;
}

Assistant:

myEmployeeCustomConstructor(int m_kids, double m_latitude)
        : myEmployee(80, 4000), 
        latitude(m_latitude),
        kids(m_kids),
        legs (2) {}